

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreeFilterOne2(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  int iVar1;
  int iVar2;
  uint Entry;
  int Entry_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  Gia_Obj_t *pGVar6;
  int iVar7;
  int i;
  
  p_00 = Vec_BitStart(p->nObjs);
  p_01 = Vec_BitStart(p->nObjs);
  iVar7 = 1;
  while( true ) {
    iVar1 = vTree->nSize;
    if (iVar1 <= iVar7) break;
    iVar1 = Vec_IntEntry(vTree,iVar7 + -1);
    Vec_IntEntry(vTree,iVar7);
    iVar1 = iVar1 * 6;
    iVar2 = Vec_IntEntry(vAdds,iVar1);
    Vec_BitWriteEntry(p_00,iVar2,1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 + 1);
    Vec_BitWriteEntry(p_00,iVar2,1);
    iVar1 = Vec_IntEntry(vAdds,iVar1 + 2);
    Vec_BitWriteEntry(p_00,iVar1,1);
    iVar7 = iVar7 + 2;
  }
  for (iVar7 = 1; iVar7 < iVar1; iVar7 = iVar7 + 2) {
    iVar1 = Vec_IntEntry(vTree,iVar7 + -1);
    Vec_IntEntry(vTree,iVar7);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
    Vec_BitWriteEntry(p_00,iVar2,0);
    iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
    Vec_BitWriteEntry(p_00,iVar1,0);
    iVar1 = vTree->nSize;
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar6 = Gia_ManObj(p,iVar7);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iVar1 = Vec_BitEntry(p_00,iVar7);
      if (iVar1 != 0) {
        Acec_TreeMarkTFI_rec(p,iVar7,p_01);
      }
    }
  }
  iVar7 = 1;
  iVar1 = 0;
  do {
    if (vTree->nSize <= iVar7) {
      Vec_IntShrink(vTree,iVar1);
      Vec_BitFree(p_00);
      Vec_BitFree(p_01);
      return;
    }
    Entry = Vec_IntEntry(vTree,iVar7 + -1);
    Entry_00 = Vec_IntEntry(vTree,iVar7);
    iVar2 = Entry * 6 + 3;
    iVar3 = Vec_IntEntry(vAdds,iVar2);
    iVar3 = Vec_BitEntry(p_01,iVar3);
    i = Entry * 6 + 4;
    if (iVar3 == 0) {
      iVar3 = Vec_IntEntry(vAdds,i);
      iVar3 = Vec_BitEntry(p_01,iVar3);
      if (iVar3 != 0) goto LAB_00546115;
      iVar2 = iVar1 + 1;
      Vec_IntWriteEntry(vTree,iVar1,Entry);
      iVar1 = iVar1 + 2;
      Vec_IntWriteEntry(vTree,iVar2,Entry_00);
    }
    else {
LAB_00546115:
      uVar4 = Vec_IntEntry(vAdds,iVar2);
      uVar5 = Vec_IntEntry(vAdds,i);
      printf("Removing box %d=(%d,%d) of rank %d.\n",(ulong)Entry,(ulong)uVar4,(ulong)uVar5,Entry_00
            );
    }
    iVar7 = iVar7 + 2;
  } while( true );
}

Assistant:

void Acec_TreeFilterOne2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vMarked = Vec_BitStart( Gia_ManObjNum(p) ) ;
    Gia_Obj_t * pObj;
    int i, k = 0, Box, Rank;
    // mark leaves
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
    }
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+3), 0 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4), 0 );
    }
    // mark TFI of leaves
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_BitEntry(vIsLeaf, i) )
            Acec_TreeMarkTFI_rec( p, i, vMarked );
    // additional one
//if ( 10942 < Gia_ManObjNum(p) )
//    Acec_TreeMarkTFI_rec( p, 10942, vMarked );
    // remove those that overlap with the marked TFI
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        if ( Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+3)) || Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+4)) )
        {
            printf( "Removing box %d=(%d,%d) of rank %d.\n", Box, Vec_IntEntry(vAdds, 6*Box+3), Vec_IntEntry(vAdds, 6*Box+4), Rank ); 
            continue;
        }
        Vec_IntWriteEntry( vTree, k++, Box );
        Vec_IntWriteEntry( vTree, k++, Rank );
    }
    Vec_IntShrink( vTree, k );
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vMarked );
}